

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

bool __thiscall
RtApiAlsa::probeDeviceOpen
          (RtApiAlsa *this,uint deviceId,StreamMode mode,uint channels,uint firstChannel,
          uint sampleRate,RtAudioFormat format,uint *bufferSize,StreamOptions *options)

{
  uint uVar1;
  RtAudioFormat RVar2;
  undefined8 uVar3;
  long lVar4;
  RtApi *pRVar5;
  RtApi *pRVar6;
  undefined1 *puVar7;
  RtApiAlsa *pRVar8;
  snd_pcm_uframes_t sVar9;
  long lVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this_00;
  undefined8 uVar14;
  size_t sVar15;
  ostream *poVar16;
  char *pcVar17;
  bad_alloc **ppbVar18;
  AlsaHandle *pAVar19;
  pthread_cond_t *__cond;
  undefined8 uStack_650;
  bad_alloc *local_648;
  int local_63c;
  uint local_638;
  uint local_634;
  uint local_630;
  uint local_62c;
  int local_628;
  uint local_624;
  AlsaHandle *local_620;
  ostream *local_618;
  char *local_610;
  ostream *local_608;
  ostream *local_600;
  ostream *local_5f8;
  int local_5ec;
  undefined1 *local_5e8;
  size_t local_5e0;
  long local_5d8;
  ostream *local_5d0;
  char *local_5c8;
  ostream *local_5c0;
  ostream *local_5b8;
  ostream *local_5b0;
  int local_5a4;
  ostream *local_5a0;
  ostream *local_598;
  ostream *local_590;
  char *local_588;
  ostream *local_580;
  ostream *local_578;
  ostream *local_570;
  int local_564;
  ostream *local_560;
  char *local_558;
  ostream *local_550;
  ostream *local_548;
  ostream *local_540;
  int local_534;
  ostream *local_530;
  char *local_528;
  ostream *local_520;
  ostream *local_518;
  ostream *local_510;
  int local_504;
  ostream *local_500;
  char *local_4f8;
  ostream *local_4f0;
  ostream *local_4e8;
  ostream *local_4e0;
  int local_4d4;
  ostream *local_4d0;
  char *local_4c8;
  ostream *local_4c0;
  ostream *local_4b8;
  ostream *local_4b0;
  int local_4a4;
  ostream *local_4a0;
  char *local_498;
  ostream *local_490;
  ostream *local_488;
  ostream *local_480;
  int local_474;
  ostream *local_470;
  char *local_468;
  ostream *local_460;
  ostream *local_458;
  ostream *local_450;
  int local_444;
  ostream *local_440;
  char *local_438;
  ostream *local_430;
  ostream *local_428;
  ostream *local_420;
  int local_414;
  ostream *local_410;
  ostream *local_408;
  int local_3fc;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  ostream *local_3e0;
  char *local_3d8;
  ostream *local_3d0;
  ostream *local_3c8;
  ostream *local_3c0;
  int local_3b8;
  int local_3b4;
  int local_3b0;
  int local_3ac;
  ostream *local_3a8;
  char *local_3a0;
  ostream *local_398;
  ostream *local_390;
  ostream *local_388;
  int local_37c;
  undefined1 *local_378;
  size_t local_370;
  long local_368;
  ostream *local_360;
  ostream *local_358;
  ostream *local_350;
  ostream *local_348;
  int local_33c;
  RtApiAlsa *local_338;
  int local_32c;
  int local_328;
  int i;
  int max;
  int min;
  int priority;
  sched_param param;
  pthread_attr_t attr;
  unsigned_long bytesOut;
  bool makeBuffer;
  unsigned_long bufferBytes;
  bad_alloc *anon_var_0;
  AlsaHandle *apiInfo;
  undefined8 local_298;
  snd_pcm_uframes_t val;
  snd_pcm_sw_params_t *sw_params;
  string local_268 [32];
  string local_248 [36];
  uint local_224;
  string local_220 [4];
  uint periods;
  ulong local_200;
  snd_pcm_uframes_t periodSize;
  string local_1f0 [4];
  int dir;
  string local_1d0 [32];
  string local_1b0 [32];
  uint local_190;
  uint local_18c;
  uint deviceChannels;
  uint value;
  string local_168 [32];
  string local_148 [32];
  string local_128 [36];
  int local_104;
  string local_100 [4];
  snd_pcm_format_t deviceFormat;
  string local_e0 [32];
  undefined1 *local_c0;
  snd_pcm_hw_params_t *hw_params;
  string local_b0 [32];
  int local_90;
  undefined4 local_8c;
  int result;
  int openMode;
  snd_pcm_t *phandle;
  snd_pcm_stream_t stream;
  reference local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *id;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *__range1;
  string name;
  uint sampleRate_local;
  uint firstChannel_local;
  uint channels_local;
  StreamMode mode_local;
  uint deviceId_local;
  RtApiAlsa *this_local;
  
  ppbVar18 = &local_648;
  uStack_650 = 0x2244b0;
  local_338 = this;
  name.field_2._12_4_ = sampleRate;
  std::__cxx11::string::string((string *)&__range1);
  this_00 = &local_338->deviceIdPairs_;
  uStack_650 = 0x2244ca;
  __end1 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::begin(this_00);
  uStack_650 = 0x2244d7;
  id = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::end(this_00);
  while( true ) {
    uStack_650 = 0x2244e8;
    bVar11 = __gnu_cxx::operator!=
                       (&__end1,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                                 *)&id);
    if (!bVar11) break;
    uStack_650 = 0x2244f7;
    local_70 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
               ::operator*(&__end1);
    if (local_70->second == deviceId) {
      uStack_650 = 0x224514;
      std::__cxx11::string::operator=((string *)&__range1,(string *)local_70);
      break;
    }
    uStack_650 = 0x224534;
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
    ::operator++(&__end1);
  }
  phandle._0_4_ = (uint)(mode != OUTPUT);
  local_8c = 2;
  uStack_650 = 0x22455f;
  uVar14 = std::__cxx11::string::c_str();
  uStack_650 = 0x224574;
  local_33c = snd_pcm_open(&result,uVar14,(uint)phandle,local_8c);
  local_90 = local_33c;
  if (local_33c < 0) {
    if (mode == OUTPUT) {
      uStack_650 = 0x2245b2;
      local_348 = std::operator<<((ostream *)&(local_338->super_RtApi).errorStream_,
                                  "RtApiAlsa::probeDeviceOpen: pcm device (");
      uStack_650 = 0x2245cb;
      local_350 = std::operator<<(local_348,(string *)&__range1);
      uStack_650 = 0x2245e7;
      std::operator<<(local_350,") won\'t open for output.");
    }
    else {
      uStack_650 = 0x224602;
      local_358 = std::operator<<((ostream *)&(local_338->super_RtApi).errorStream_,
                                  "RtApiAlsa::probeDeviceOpen: pcm device (");
      uStack_650 = 0x22461b;
      local_360 = std::operator<<(local_358,(string *)&__range1);
      uStack_650 = 0x224637;
      std::operator<<(local_360,") won\'t open for input.");
    }
    uStack_650 = 0x224652;
    std::__cxx11::ostringstream::str();
    uStack_650 = 0x22466e;
    std::__cxx11::string::operator=((string *)&(local_338->super_RtApi).errorText_,local_b0);
    uStack_650 = 0x22467a;
    std::__cxx11::string::~string(local_b0);
    this_local._7_1_ = false;
    goto LAB_0022657d;
  }
  uStack_650 = 0x224694;
  local_368 = snd_pcm_hw_params_sizeof();
  lVar4 = -(local_368 + 0xfU & 0xfffffffffffffff0);
  ppbVar18 = (bad_alloc **)((long)&local_648 + lVar4);
  local_378 = (undefined1 *)ppbVar18;
  local_c0 = (undefined1 *)ppbVar18;
  *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2246cf;
  sVar15 = snd_pcm_hw_params_sizeof();
  puVar7 = local_378;
  local_370 = sVar15;
  *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2246ed;
  memset(puVar7,0,sVar15);
  lVar10 = _result;
  puVar7 = local_c0;
  *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2246ff;
  local_37c = snd_pcm_hw_params_any(lVar10,puVar7);
  lVar10 = _result;
  puVar7 = local_c0;
  local_90 = local_37c;
  if (local_37c < 0) {
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224729;
    snd_pcm_close(lVar10);
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224742;
    poVar16 = std::operator<<((ostream *)&pRVar5->errorStream_,
                              "RtApiAlsa::probeDeviceOpen: error getting pcm device (");
    local_388 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22475b;
    poVar16 = std::operator<<(poVar16,(string *)&__range1);
    local_390 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224777;
    local_398 = std::operator<<(poVar16,") parameters, ");
    iVar12 = local_90;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22478b;
    pcVar17 = (char *)snd_strerror(iVar12);
    poVar16 = local_398;
    local_3a0 = pcVar17;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2247a7;
    poVar16 = std::operator<<(poVar16,pcVar17);
    local_3a8 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2247c3;
    std::operator<<(poVar16,".");
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2247dc;
    std::__cxx11::ostringstream::str();
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2247f8;
    std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_e0);
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224804;
    std::__cxx11::string::~string(local_e0);
    this_local._7_1_ = false;
    goto LAB_0022657d;
  }
  if ((options == (StreamOptions *)0x0) || ((options->flags & 1) == 0)) {
    (local_338->super_RtApi).stream_.userInterleaved = true;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2248ed;
    local_3b4 = snd_pcm_hw_params_set_access(lVar10,puVar7,3);
    lVar10 = _result;
    puVar7 = local_c0;
    local_90 = local_3b4;
    if (local_3b4 < 0) {
      *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22491f;
      local_3b8 = snd_pcm_hw_params_set_access(lVar10,puVar7,4);
      (local_338->super_RtApi).stream_.deviceInterleaved[mode] = false;
      local_90 = local_3b8;
    }
    else {
      (local_338->super_RtApi).stream_.deviceInterleaved[mode] = true;
    }
  }
  else {
    (local_338->super_RtApi).stream_.userInterleaved = false;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224857;
    local_3ac = snd_pcm_hw_params_set_access(lVar10,puVar7,4);
    lVar10 = _result;
    puVar7 = local_c0;
    local_90 = local_3ac;
    if (local_3ac < 0) {
      *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224889;
      local_3b0 = snd_pcm_hw_params_set_access(lVar10,puVar7,3);
      (local_338->super_RtApi).stream_.deviceInterleaved[mode] = true;
      local_90 = local_3b0;
    }
    else {
      (local_338->super_RtApi).stream_.deviceInterleaved[mode] = false;
    }
  }
  lVar10 = _result;
  puVar7 = local_c0;
  if (local_90 < 0) {
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224973;
    snd_pcm_close(lVar10);
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22498c;
    poVar16 = std::operator<<((ostream *)&pRVar5->errorStream_,
                              "RtApiAlsa::probeDeviceOpen: error setting pcm device (");
    local_3c0 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2249a5;
    poVar16 = std::operator<<(poVar16,(string *)&__range1);
    local_3c8 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2249c1;
    local_3d0 = std::operator<<(poVar16,") access, ");
    iVar12 = local_90;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2249d5;
    pcVar17 = (char *)snd_strerror(iVar12);
    poVar16 = local_3d0;
    local_3d8 = pcVar17;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2249f1;
    poVar16 = std::operator<<(poVar16,pcVar17);
    local_3e0 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224a0d;
    std::operator<<(poVar16,".");
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224a26;
    std::__cxx11::ostringstream::str();
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224a42;
    std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_100);
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224a4e;
    std::__cxx11::string::~string(local_100);
    this_local._7_1_ = false;
    goto LAB_0022657d;
  }
  (local_338->super_RtApi).stream_.userFormat = format;
  local_104 = -1;
  if (format == 1) {
    local_104 = 0;
  }
  else if (format == 2) {
    local_104 = 2;
  }
  else if (format == 4) {
    local_104 = 6;
  }
  else if (format == 8) {
    local_104 = 10;
  }
  else if (format == 0x10) {
    local_104 = 0xe;
  }
  else if (format == 0x20) {
    local_104 = 0x10;
  }
  iVar12 = local_104;
  *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224b0d;
  local_3e4 = snd_pcm_hw_params_test_format(lVar10,puVar7,iVar12);
  lVar10 = _result;
  puVar7 = local_c0;
  if (local_3e4 == 0) {
    (local_338->super_RtApi).stream_.deviceFormat[mode] = format;
  }
  else {
    local_104 = 0x10;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224b5c;
    local_3e8 = snd_pcm_hw_params_test_format(lVar10,puVar7,0x10);
    lVar10 = _result;
    puVar7 = local_c0;
    if (local_3e8 == 0) {
      (local_338->super_RtApi).stream_.deviceFormat[mode] = 0x20;
    }
    else {
      local_104 = 0xe;
      *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224bab;
      local_3ec = snd_pcm_hw_params_test_format(lVar10,puVar7,0xe);
      lVar10 = _result;
      puVar7 = local_c0;
      if (local_3ec == 0) {
        (local_338->super_RtApi).stream_.deviceFormat[mode] = 0x10;
      }
      else {
        local_104 = 10;
        *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224bfa;
        local_3f0 = snd_pcm_hw_params_test_format(lVar10,puVar7,10);
        lVar10 = _result;
        puVar7 = local_c0;
        if (local_3f0 == 0) {
          (local_338->super_RtApi).stream_.deviceFormat[mode] = 8;
        }
        else {
          local_104 = 6;
          *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224c49;
          local_3f4 = snd_pcm_hw_params_test_format(lVar10,puVar7,6);
          lVar10 = _result;
          puVar7 = local_c0;
          if (local_3f4 == 0) {
            (local_338->super_RtApi).stream_.deviceFormat[mode] = 4;
          }
          else {
            local_104 = 2;
            *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224c98;
            local_3f8 = snd_pcm_hw_params_test_format(lVar10,puVar7,2);
            lVar10 = _result;
            puVar7 = local_c0;
            if (local_3f8 == 0) {
              (local_338->super_RtApi).stream_.deviceFormat[mode] = 2;
            }
            else {
              local_104 = 0;
              *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224ce7;
              local_3fc = snd_pcm_hw_params_test_format(lVar10,puVar7,0);
              lVar10 = _result;
              if (local_3fc != 0) {
                *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224d1f;
                snd_pcm_close(lVar10);
                pRVar5 = &local_338->super_RtApi;
                *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224d38;
                poVar16 = std::operator<<((ostream *)&pRVar5->errorStream_,
                                          "RtApiAlsa::probeDeviceOpen: pcm device (");
                local_408 = poVar16;
                *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224d51;
                poVar16 = std::operator<<(poVar16,(string *)&__range1);
                local_410 = poVar16;
                *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224d6d;
                std::operator<<(poVar16,") data format not supported by RtAudio.");
                *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224d86;
                std::__cxx11::ostringstream::str();
                pRVar5 = &local_338->super_RtApi;
                *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224da2;
                std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_128);
                *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224dae;
                std::__cxx11::string::~string(local_128);
                this_local._7_1_ = false;
                goto LAB_0022657d;
              }
              (local_338->super_RtApi).stream_.deviceFormat[mode] = 1;
            }
          }
        }
      }
    }
  }
  lVar10 = _result;
  puVar7 = local_c0;
  iVar12 = local_104;
  *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224dd7;
  local_414 = snd_pcm_hw_params_set_format(lVar10,puVar7,iVar12);
  lVar10 = _result;
  iVar12 = local_104;
  local_90 = local_414;
  if (local_414 < 0) {
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224e01;
    snd_pcm_close(lVar10);
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224e1a;
    poVar16 = std::operator<<((ostream *)&pRVar5->errorStream_,
                              "RtApiAlsa::probeDeviceOpen: error setting pcm device (");
    local_420 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224e33;
    poVar16 = std::operator<<(poVar16,(string *)&__range1);
    local_428 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224e4f;
    local_430 = std::operator<<(poVar16,") data format, ");
    iVar12 = local_90;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224e63;
    pcVar17 = (char *)snd_strerror(iVar12);
    poVar16 = local_430;
    local_438 = pcVar17;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224e7f;
    poVar16 = std::operator<<(poVar16,pcVar17);
    local_440 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224e9b;
    std::operator<<(poVar16,".");
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224eb4;
    std::__cxx11::ostringstream::str();
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224ed0;
    std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_148);
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224edc;
    std::__cxx11::string::~string(local_148);
    this_local._7_1_ = false;
    goto LAB_0022657d;
  }
  (local_338->super_RtApi).stream_.doByteSwap[mode] = false;
  if (local_104 != 0) {
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224f1a;
    local_444 = snd_pcm_format_cpu_endian(iVar12);
    lVar10 = _result;
    local_90 = local_444;
    if (local_444 == 0) {
      (local_338->super_RtApi).stream_.doByteSwap[mode] = true;
    }
    else if (local_444 < 0) {
      *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224f65;
      snd_pcm_close(lVar10);
      pRVar5 = &local_338->super_RtApi;
      *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224f7e;
      poVar16 = std::operator<<((ostream *)&pRVar5->errorStream_,
                                "RtApiAlsa::probeDeviceOpen: error getting pcm device (");
      local_450 = poVar16;
      *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224f97;
      poVar16 = std::operator<<(poVar16,(string *)&__range1);
      local_458 = poVar16;
      *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224fb3;
      local_460 = std::operator<<(poVar16,") endian-ness, ");
      iVar12 = local_90;
      *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224fc7;
      pcVar17 = (char *)snd_strerror(iVar12);
      poVar16 = local_460;
      local_468 = pcVar17;
      *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224fe3;
      poVar16 = std::operator<<(poVar16,pcVar17);
      local_470 = poVar16;
      *(undefined8 *)((long)&uStack_650 + lVar4) = 0x224fff;
      std::operator<<(poVar16,".");
      *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225018;
      std::__cxx11::ostringstream::str();
      pRVar5 = &local_338->super_RtApi;
      *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225034;
      std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_168);
      *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225040;
      std::__cxx11::string::~string(local_168);
      this_local._7_1_ = false;
      goto LAB_0022657d;
    }
  }
  lVar10 = _result;
  puVar7 = local_c0;
  *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22506f;
  local_474 = snd_pcm_hw_params_set_rate_near
                        (lVar10,puVar7,(undefined1 *)((long)&name.field_2 + 0xc),0);
  lVar10 = _result;
  puVar7 = local_c0;
  local_90 = local_474;
  if (local_474 < 0) {
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225099;
    snd_pcm_close(lVar10);
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2250b2;
    poVar16 = std::operator<<((ostream *)&pRVar5->errorStream_,
                              "RtApiAlsa::probeDeviceOpen: error setting sample rate on device (");
    local_480 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2250cb;
    poVar16 = std::operator<<(poVar16,(string *)&__range1);
    local_488 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2250e7;
    local_490 = std::operator<<(poVar16,"), ");
    iVar12 = local_90;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2250fb;
    pcVar17 = (char *)snd_strerror(iVar12);
    poVar16 = local_490;
    local_498 = pcVar17;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225117;
    poVar16 = std::operator<<(poVar16,pcVar17);
    local_4a0 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225133;
    std::operator<<(poVar16,".");
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22514c;
    std::__cxx11::ostringstream::str();
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225168;
    std::__cxx11::string::operator=((string *)&pRVar5->errorText_,(string *)&deviceChannels);
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225174;
    std::__cxx11::string::~string((string *)&deviceChannels);
    this_local._7_1_ = false;
    goto LAB_0022657d;
  }
  (local_338->super_RtApi).stream_.nUserChannels[mode] = channels;
  *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2251af;
  local_4a4 = snd_pcm_hw_params_get_channels_max(puVar7,&local_18c);
  lVar10 = _result;
  puVar7 = local_c0;
  local_190 = local_18c;
  local_90 = local_4a4;
  if ((local_4a4 < 0) || (local_18c < channels + firstChannel)) {
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2251f5;
    snd_pcm_close(lVar10);
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22520e;
    poVar16 = std::operator<<((ostream *)&pRVar5->errorStream_,
                              "RtApiAlsa::probeDeviceOpen: requested channel parameters not supported by device ("
                             );
    local_4b0 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225227;
    poVar16 = std::operator<<(poVar16,(string *)&__range1);
    local_4b8 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225243;
    local_4c0 = std::operator<<(poVar16,"), ");
    iVar12 = local_90;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225257;
    pcVar17 = (char *)snd_strerror(iVar12);
    poVar16 = local_4c0;
    local_4c8 = pcVar17;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225273;
    poVar16 = std::operator<<(poVar16,pcVar17);
    local_4d0 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22528f;
    std::operator<<(poVar16,".");
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2252a8;
    std::__cxx11::ostringstream::str();
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2252c4;
    std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_1b0);
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2252d0;
    std::__cxx11::string::~string(local_1b0);
    this_local._7_1_ = false;
    goto LAB_0022657d;
  }
  *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2252f6;
  local_4d4 = snd_pcm_hw_params_get_channels_min(puVar7,&local_18c);
  lVar10 = _result;
  puVar7 = local_c0;
  local_90 = local_4d4;
  if (local_4d4 < 0) {
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225320;
    snd_pcm_close(lVar10);
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225339;
    poVar16 = std::operator<<((ostream *)&pRVar5->errorStream_,
                              "RtApiAlsa::probeDeviceOpen: error getting minimum channels for device ("
                             );
    local_4e0 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225352;
    poVar16 = std::operator<<(poVar16,(string *)&__range1);
    local_4e8 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22536e;
    local_4f0 = std::operator<<(poVar16,"), ");
    iVar12 = local_90;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225382;
    pcVar17 = (char *)snd_strerror(iVar12);
    poVar16 = local_4f0;
    local_4f8 = pcVar17;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22539e;
    poVar16 = std::operator<<(poVar16,pcVar17);
    local_500 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2253ba;
    std::operator<<(poVar16,".");
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2253d3;
    std::__cxx11::ostringstream::str();
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2253ef;
    std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_1d0);
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2253fb;
    std::__cxx11::string::~string(local_1d0);
    this_local._7_1_ = false;
    goto LAB_0022657d;
  }
  local_190 = local_18c;
  if (local_18c < channels + firstChannel) {
    local_190 = channels + firstChannel;
  }
  uVar13 = local_190;
  (local_338->super_RtApi).stream_.nDeviceChannels[mode] = local_190;
  *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225464;
  local_504 = snd_pcm_hw_params_set_channels(lVar10,puVar7,uVar13);
  lVar10 = _result;
  puVar7 = local_c0;
  local_90 = local_504;
  if (local_504 < 0) {
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22548e;
    snd_pcm_close(lVar10);
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2254a7;
    poVar16 = std::operator<<((ostream *)&pRVar5->errorStream_,
                              "RtApiAlsa::probeDeviceOpen: error setting channels for device (");
    local_510 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2254c0;
    poVar16 = std::operator<<(poVar16,(string *)&__range1);
    local_518 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2254dc;
    local_520 = std::operator<<(poVar16,"), ");
    iVar12 = local_90;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2254f0;
    pcVar17 = (char *)snd_strerror(iVar12);
    poVar16 = local_520;
    local_528 = pcVar17;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22550c;
    poVar16 = std::operator<<(poVar16,pcVar17);
    local_530 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225528;
    std::operator<<(poVar16,".");
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225541;
    std::__cxx11::ostringstream::str();
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22555d;
    std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_1f0);
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225569;
    std::__cxx11::string::~string(local_1f0);
    this_local._7_1_ = false;
    goto LAB_0022657d;
  }
  periodSize._4_4_ = 0;
  local_200 = (ulong)*bufferSize;
  *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2255b1;
  local_534 = snd_pcm_hw_params_set_period_size_near(lVar10,puVar7,&local_200,(long)&periodSize + 4)
  ;
  lVar10 = _result;
  puVar7 = local_c0;
  local_90 = local_534;
  if (local_534 < 0) {
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2255db;
    snd_pcm_close(lVar10);
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2255f4;
    poVar16 = std::operator<<((ostream *)&pRVar5->errorStream_,
                              "RtApiAlsa::probeDeviceOpen: error setting period size for device (");
    local_540 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22560d;
    poVar16 = std::operator<<(poVar16,(string *)&__range1);
    local_548 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225629;
    local_550 = std::operator<<(poVar16,"), ");
    iVar12 = local_90;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22563d;
    pcVar17 = (char *)snd_strerror(iVar12);
    poVar16 = local_550;
    local_558 = pcVar17;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225659;
    poVar16 = std::operator<<(poVar16,pcVar17);
    local_560 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225675;
    std::operator<<(poVar16,".");
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22568e;
    std::__cxx11::ostringstream::str();
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2256aa;
    std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_220);
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2256b6;
    std::__cxx11::string::~string(local_220);
    this_local._7_1_ = false;
    goto LAB_0022657d;
  }
  *bufferSize = (uint)local_200;
  local_224 = 0;
  if ((options != (StreamOptions *)0x0) && ((options->flags & 2) != 0)) {
    local_224 = 2;
  }
  if ((options != (StreamOptions *)0x0) && (options->numberOfBuffers != 0)) {
    local_224 = options->numberOfBuffers;
  }
  if (local_224 < 2) {
    local_224 = 4;
  }
  *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225750;
  local_564 = snd_pcm_hw_params_set_periods_near(lVar10,puVar7,&local_224,(long)&periodSize + 4);
  lVar10 = _result;
  local_90 = local_564;
  if (local_564 < 0) {
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22577a;
    snd_pcm_close(lVar10);
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225793;
    poVar16 = std::operator<<((ostream *)&pRVar5->errorStream_,
                              "RtApiAlsa::probeDeviceOpen: error setting periods for device (");
    local_570 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2257ac;
    poVar16 = std::operator<<(poVar16,(string *)&__range1);
    local_578 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2257c8;
    local_580 = std::operator<<(poVar16,"), ");
    iVar12 = local_90;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2257dc;
    pcVar17 = (char *)snd_strerror(iVar12);
    poVar16 = local_580;
    local_588 = pcVar17;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2257f8;
    poVar16 = std::operator<<(poVar16,pcVar17);
    local_590 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225814;
    std::operator<<(poVar16,".");
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22582d;
    std::__cxx11::ostringstream::str();
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225849;
    std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_248);
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225855;
    std::__cxx11::string::~string(local_248);
    this_local._7_1_ = false;
    goto LAB_0022657d;
  }
  if ((((local_338->super_RtApi).stream_.mode == OUTPUT) && (mode == INPUT)) &&
     (*bufferSize != (local_338->super_RtApi).stream_.bufferSize)) {
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2258a8;
    snd_pcm_close(lVar10);
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2258c1;
    poVar16 = std::operator<<((ostream *)&pRVar5->errorStream_,
                              "RtApiAlsa::probeDeviceOpen: system error setting buffer size for duplex stream on device ("
                             );
    local_598 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2258da;
    poVar16 = std::operator<<(poVar16,(string *)&__range1);
    local_5a0 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2258f6;
    std::operator<<(poVar16,").");
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22590f;
    std::__cxx11::ostringstream::str();
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22592b;
    std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_268);
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225937;
    std::__cxx11::string::~string(local_268);
    this_local._7_1_ = false;
    goto LAB_0022657d;
  }
  (local_338->super_RtApi).stream_.bufferSize = *bufferSize;
  *(undefined8 *)((long)&uStack_650 + lVar4) = 0x22596d;
  local_5a4 = snd_pcm_hw_params(lVar10);
  lVar10 = _result;
  local_90 = local_5a4;
  if (local_5a4 < 0) {
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225997;
    snd_pcm_close(lVar10);
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2259b0;
    poVar16 = std::operator<<((ostream *)&pRVar5->errorStream_,
                              "RtApiAlsa::probeDeviceOpen: error installing hardware configuration on device ("
                             );
    local_5b0 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2259c9;
    poVar16 = std::operator<<(poVar16,(string *)&__range1);
    local_5b8 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2259e5;
    local_5c0 = std::operator<<(poVar16,"), ");
    iVar12 = local_90;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x2259f9;
    pcVar17 = (char *)snd_strerror(iVar12);
    poVar16 = local_5c0;
    local_5c8 = pcVar17;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225a15;
    poVar16 = std::operator<<(poVar16,pcVar17);
    local_5d0 = poVar16;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225a31;
    std::operator<<(poVar16,".");
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225a4a;
    std::__cxx11::ostringstream::str();
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225a66;
    std::__cxx11::string::operator=((string *)&pRVar5->errorText_,(string *)&sw_params);
    *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225a72;
    std::__cxx11::string::~string((string *)&sw_params);
    this_local._7_1_ = false;
    goto LAB_0022657d;
  }
  val = 0;
  *(undefined8 *)((long)&uStack_650 + lVar4) = 0x225a95;
  local_5d8 = snd_pcm_sw_params_sizeof();
  ppbVar18 = (bad_alloc **)((long)ppbVar18 + -(local_5d8 + 0xfU & 0xfffffffffffffff0));
  local_5e8 = (undefined1 *)ppbVar18;
  val = (snd_pcm_uframes_t)ppbVar18;
  *(undefined8 *)((long)ppbVar18 + -8) = 0x225ad0;
  sVar15 = snd_pcm_sw_params_sizeof();
  puVar7 = local_5e8;
  local_5e0 = sVar15;
  *(undefined8 *)((long)ppbVar18 + -8) = 0x225aee;
  memset(puVar7,0,sVar15);
  lVar4 = _result;
  sVar9 = val;
  *(undefined8 *)((long)ppbVar18 + -8) = 0x225b00;
  snd_pcm_sw_params_current(lVar4,sVar9);
  lVar4 = _result;
  sVar9 = val;
  uVar13 = *bufferSize;
  *(undefined8 *)((long)ppbVar18 + -8) = 0x225b1a;
  snd_pcm_sw_params_set_start_threshold(lVar4,sVar9,uVar13);
  lVar4 = _result;
  sVar9 = val;
  *(undefined8 *)((long)ppbVar18 + -8) = 0x225b33;
  snd_pcm_sw_params_set_stop_threshold(lVar4,sVar9,0xffffffffffffffff);
  lVar4 = _result;
  sVar9 = val;
  *(undefined8 *)((long)ppbVar18 + -8) = 0x225b49;
  snd_pcm_sw_params_set_silence_threshold(lVar4,sVar9,0);
  sVar9 = val;
  *(undefined8 *)((long)ppbVar18 + -8) = 0x225b5e;
  snd_pcm_sw_params_get_boundary(sVar9,&local_298);
  lVar4 = _result;
  sVar9 = val;
  *(undefined8 *)((long)ppbVar18 + -8) = 0x225b77;
  snd_pcm_sw_params_set_silence_size(lVar4,sVar9,local_298);
  lVar4 = _result;
  sVar9 = val;
  *(undefined8 *)((long)ppbVar18 + -8) = 0x225b89;
  local_5ec = snd_pcm_sw_params(lVar4,sVar9);
  lVar4 = _result;
  local_90 = local_5ec;
  if (local_5ec < 0) {
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225bb3;
    snd_pcm_close(lVar4);
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225bcc;
    poVar16 = std::operator<<((ostream *)&pRVar5->errorStream_,
                              "RtApiAlsa::probeDeviceOpen: error installing software configuration on device ("
                             );
    local_5f8 = poVar16;
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225be5;
    poVar16 = std::operator<<(poVar16,(string *)&__range1);
    local_600 = poVar16;
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225c01;
    local_608 = std::operator<<(poVar16,"), ");
    iVar12 = local_90;
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225c15;
    pcVar17 = (char *)snd_strerror(iVar12);
    poVar16 = local_608;
    local_610 = pcVar17;
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225c31;
    poVar16 = std::operator<<(poVar16,pcVar17);
    local_618 = poVar16;
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225c4d;
    std::operator<<(poVar16,".");
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225c66;
    std::__cxx11::ostringstream::str();
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225c82;
    std::__cxx11::string::operator=((string *)&pRVar5->errorText_,(string *)&apiInfo);
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225c8e;
    std::__cxx11::string::~string((string *)&apiInfo);
    this_local._7_1_ = false;
    goto LAB_0022657d;
  }
  (local_338->super_RtApi).stream_.doConvertBuffer[mode] = false;
  if ((local_338->super_RtApi).stream_.userFormat !=
      (local_338->super_RtApi).stream_.deviceFormat[mode]) {
    (local_338->super_RtApi).stream_.doConvertBuffer[mode] = true;
  }
  if ((local_338->super_RtApi).stream_.nUserChannels[mode] <
      (local_338->super_RtApi).stream_.nDeviceChannels[mode]) {
    (local_338->super_RtApi).stream_.doConvertBuffer[mode] = true;
  }
  if ((((local_338->super_RtApi).stream_.userInterleaved & 1U) !=
       ((local_338->super_RtApi).stream_.deviceInterleaved[mode] & 1U)) &&
     (1 < (local_338->super_RtApi).stream_.nUserChannels[mode])) {
    (local_338->super_RtApi).stream_.doConvertBuffer[mode] = true;
  }
  if ((local_338->super_RtApi).stream_.apiHandle == (void *)0x0) {
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225d87;
    pAVar19 = (AlsaHandle *)operator_new(0x50);
    local_620 = pAVar19;
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225d9c;
    AlsaHandle::AlsaHandle(pAVar19);
    pAVar19 = local_620;
    anon_var_0 = (bad_alloc *)local_620;
    __cond = &local_620->runnable_cv;
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225e64;
    iVar12 = pthread_cond_init((pthread_cond_t *)__cond,(pthread_condattr_t *)0x0);
    if (iVar12 == 0) {
      (local_338->super_RtApi).stream_.apiHandle = pAVar19;
      pAVar19->handles[0] = (snd_pcm_t *)0x0;
      pAVar19->handles[1] = (snd_pcm_t *)0x0;
      goto LAB_00225ed3;
    }
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225e83;
    std::__cxx11::string::operator=
              ((string *)&pRVar5->errorText_,
               "RtApiAlsa::probeDeviceOpen: error initializing pthread condition variable.");
  }
  else {
    anon_var_0 = (bad_alloc *)(local_338->super_RtApi).stream_.apiHandle;
LAB_00225ed3:
    pRVar8 = local_338;
    *(long *)(anon_var_0 + (long)mode * 8) = _result;
    _result = 0;
    local_628 = (local_338->super_RtApi).stream_.nUserChannels[mode] * *bufferSize;
    RVar2 = (local_338->super_RtApi).stream_.userFormat;
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225f1b;
    local_624 = RtApi::formatBytes(&pRVar8->super_RtApi,RVar2);
    uVar13 = local_628 * local_624;
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225f4c;
    pcVar17 = (char *)calloc((ulong)uVar13,1);
    pRVar8 = local_338;
    (local_338->super_RtApi).stream_.userBuffer[mode] = pcVar17;
    if ((local_338->super_RtApi).stream_.userBuffer[mode] != (char *)0x0) {
      if (((local_338->super_RtApi).stream_.doConvertBuffer[mode] & 1U) != 0) {
        bVar11 = true;
        local_630 = (local_338->super_RtApi).stream_.nDeviceChannels[mode];
        RVar2 = (local_338->super_RtApi).stream_.deviceFormat[mode];
        *(undefined8 *)((long)ppbVar18 + -8) = 0x225fd7;
        local_62c = RtApi::formatBytes(&pRVar8->super_RtApi,RVar2);
        pRVar8 = local_338;
        uVar13 = local_630 * local_62c;
        if (((mode == INPUT) && ((local_338->super_RtApi).stream_.mode == OUTPUT)) &&
           ((local_338->super_RtApi).stream_.deviceBuffer != (char *)0x0)) {
          local_638 = (local_338->super_RtApi).stream_.nDeviceChannels[0];
          RVar2 = (local_338->super_RtApi).stream_.deviceFormat[0];
          *(undefined8 *)((long)ppbVar18 + -8) = 0x22603d;
          local_634 = RtApi::formatBytes(&pRVar8->super_RtApi,RVar2);
          bVar11 = (ulong)(local_638 * local_634) < (ulong)uVar13;
        }
        if (bVar11) {
          uVar1 = *bufferSize;
          if ((local_338->super_RtApi).stream_.deviceBuffer != (char *)0x0) {
            pcVar17 = (local_338->super_RtApi).stream_.deviceBuffer;
            *(undefined8 *)((long)ppbVar18 + -8) = 0x2260be;
            free(pcVar17);
          }
          *(undefined8 *)((long)ppbVar18 + -8) = 0x2260cf;
          pcVar17 = (char *)calloc((ulong)uVar1 * (ulong)uVar13,1);
          (local_338->super_RtApi).stream_.deviceBuffer = pcVar17;
          if ((local_338->super_RtApi).stream_.deviceBuffer == (char *)0x0) {
            pRVar5 = &local_338->super_RtApi;
            *(undefined8 *)((long)ppbVar18 + -8) = 0x226104;
            std::__cxx11::string::operator=
                      ((string *)&pRVar5->errorText_,
                       "RtApiAlsa::probeDeviceOpen: error allocating device buffer memory.");
            goto LAB_0022640e;
          }
        }
      }
      pRVar8 = local_338;
      (local_338->super_RtApi).stream_.sampleRate = name.field_2._12_4_;
      (local_338->super_RtApi).stream_.nBuffers = local_224;
      (local_338->super_RtApi).stream_.deviceId[mode] = deviceId;
      (local_338->super_RtApi).stream_.state = STREAM_STOPPED;
      if (((local_338->super_RtApi).stream_.doConvertBuffer[mode] & 1U) != 0) {
        *(undefined8 *)((long)ppbVar18 + -8) = 0x226163;
        RtApi::setConvertInfo(&pRVar8->super_RtApi,mode,firstChannel);
      }
      if (((local_338->super_RtApi).stream_.mode == OUTPUT) && (mode == INPUT)) {
        (local_338->super_RtApi).stream_.mode = DUPLEX;
        anon_var_0[0x10] = (bad_alloc)0x0;
        uVar14 = *(undefined8 *)anon_var_0;
        uVar3 = *(undefined8 *)(anon_var_0 + 8);
        *(undefined8 *)((long)ppbVar18 + -8) = 0x2261b4;
        local_63c = snd_pcm_link(uVar14,uVar3);
        if (local_63c == 0) {
          anon_var_0[0x10] = (bad_alloc)0x1;
        }
        else {
          pRVar5 = &local_338->super_RtApi;
          *(undefined8 *)((long)ppbVar18 + -8) = 0x2261ee;
          std::__cxx11::string::operator=
                    ((string *)&pRVar5->errorText_,
                     "RtApiAlsa::probeDeviceOpen: unable to synchronize input and output devices.");
          pRVar8 = local_338;
          *(undefined8 *)((long)ppbVar18 + -8) = 0x226201;
          RtApi::error(&pRVar8->super_RtApi,RTAUDIO_WARNING);
        }
      }
      else {
        (local_338->super_RtApi).stream_.mode = mode;
        (local_338->super_RtApi).stream_.callbackInfo.object = local_338;
        *(undefined8 *)((long)ppbVar18 + -8) = 0x22622d;
        pthread_attr_init((pthread_attr_t *)&priority);
        *(undefined8 *)((long)ppbVar18 + -8) = 0x22623b;
        pthread_attr_setdetachstate((pthread_attr_t *)&priority,0);
        if ((options == (StreamOptions *)0x0) || ((options->flags & 8) == 0)) {
          *(undefined8 *)((long)ppbVar18 + -8) = 0x22632a;
          pthread_attr_setschedpolicy((pthread_attr_t *)&priority,0);
        }
        else {
          (local_338->super_RtApi).stream_.callbackInfo.doRealtime = true;
          max = options->priority;
          *(undefined8 *)((long)ppbVar18 + -8) = 0x22627d;
          i = sched_get_priority_min(2);
          *(undefined8 *)((long)ppbVar18 + -8) = 0x22628d;
          local_328 = sched_get_priority_max(2);
          if (max < i) {
            max = i;
          }
          else if (local_328 < max) {
            max = local_328;
          }
          min = max;
          *(undefined8 *)((long)ppbVar18 + -8) = 0x2262e8;
          pthread_attr_setschedpolicy((pthread_attr_t *)&priority,2);
          *(undefined8 *)((long)ppbVar18 + -8) = 0x2262f6;
          pthread_attr_setscope((pthread_attr_t *)&priority,0);
          *(undefined8 *)((long)ppbVar18 + -8) = 0x226307;
          pthread_attr_setinheritsched((pthread_attr_t *)&priority,1);
          *(undefined8 *)((long)ppbVar18 + -8) = 0x22631a;
          pthread_attr_setschedparam((pthread_attr_t *)&priority,(sched_param *)&min);
        }
        (local_338->super_RtApi).stream_.callbackInfo.isRunning = true;
        pRVar5 = &local_338->super_RtApi;
        pRVar6 = &local_338->super_RtApi;
        *(undefined8 *)((long)ppbVar18 + -8) = 0x22636e;
        local_90 = pthread_create(&(pRVar5->stream_).callbackInfo.thread,(pthread_attr_t *)&priority
                                  ,alsaCallbackHandler,&(pRVar6->stream_).callbackInfo);
        *(undefined8 *)((long)ppbVar18 + -8) = 0x226380;
        pthread_attr_destroy((pthread_attr_t *)&priority);
        if (local_90 != 0) {
          pRVar5 = &local_338->super_RtApi;
          pRVar6 = &local_338->super_RtApi;
          *(undefined8 *)((long)ppbVar18 + -8) = 0x2263c3;
          local_90 = pthread_create(&(pRVar5->stream_).callbackInfo.thread,(pthread_attr_t *)0x0,
                                    alsaCallbackHandler,&(pRVar6->stream_).callbackInfo);
          if (local_90 != 0) {
            (local_338->super_RtApi).stream_.callbackInfo.isRunning = false;
            pRVar5 = &local_338->super_RtApi;
            *(undefined8 *)((long)ppbVar18 + -8) = 0x2263f3;
            std::__cxx11::string::operator=
                      ((string *)&pRVar5->errorText_,"RtApiAlsa::error creating callback thread!");
            goto LAB_0022640e;
          }
        }
      }
      this_local._7_1_ = true;
      goto LAB_0022657d;
    }
    pRVar5 = &local_338->super_RtApi;
    *(undefined8 *)((long)ppbVar18 + -8) = 0x225f8b;
    std::__cxx11::string::operator=
              ((string *)&pRVar5->errorText_,
               "RtApiAlsa::probeDeviceOpen: error allocating user buffer memory.");
  }
LAB_0022640e:
  if (anon_var_0 != (bad_alloc *)0x0) {
    *(undefined8 *)((long)ppbVar18 + -8) = 0x22642c;
    pthread_cond_destroy((pthread_cond_t *)(anon_var_0 + 0x18));
    if (*(long *)anon_var_0 != 0) {
      uVar14 = *(undefined8 *)anon_var_0;
      *(undefined8 *)((long)ppbVar18 + -8) = 0x226448;
      snd_pcm_close(uVar14);
    }
    if (*(long *)(anon_var_0 + 8) != 0) {
      uVar14 = *(undefined8 *)(anon_var_0 + 8);
      *(undefined8 *)((long)ppbVar18 + -8) = 0x22646a;
      snd_pcm_close(uVar14);
    }
    local_648 = anon_var_0;
    if (anon_var_0 != (bad_alloc *)0x0) {
      *(undefined8 *)((long)ppbVar18 + -8) = 0x22648e;
      operator_delete(anon_var_0);
    }
    (local_338->super_RtApi).stream_.apiHandle = (void *)0x0;
  }
  lVar4 = _result;
  if (_result != 0) {
    *(undefined8 *)((long)ppbVar18 + -8) = 0x2264b0;
    snd_pcm_close(lVar4);
  }
  for (local_32c = 0; local_32c < 2; local_32c = local_32c + 1) {
    if ((local_338->super_RtApi).stream_.userBuffer[local_32c] != (char *)0x0) {
      pcVar17 = (local_338->super_RtApi).stream_.userBuffer[local_32c];
      *(undefined8 *)((long)ppbVar18 + -8) = 0x2264fb;
      free(pcVar17);
      (local_338->super_RtApi).stream_.userBuffer[local_32c] = (char *)0x0;
    }
  }
  if ((local_338->super_RtApi).stream_.deviceBuffer != (char *)0x0) {
    pcVar17 = (local_338->super_RtApi).stream_.deviceBuffer;
    *(undefined8 *)((long)ppbVar18 + -8) = 0x22654c;
    free(pcVar17);
    (local_338->super_RtApi).stream_.deviceBuffer = (char *)0x0;
  }
  (local_338->super_RtApi).stream_.state = STREAM_CLOSED;
  this_local._7_1_ = false;
LAB_0022657d:
  hw_params._4_4_ = 1;
  *(undefined8 *)((long)ppbVar18 + -8) = 0x226586;
  std::__cxx11::string::~string((string *)&__range1);
  return this_local._7_1_;
}

Assistant:

bool RtApiAlsa :: probeDeviceOpen( unsigned int deviceId, StreamMode mode, unsigned int channels,
                                   unsigned int firstChannel, unsigned int sampleRate,
                                   RtAudioFormat format, unsigned int *bufferSize,
                                   RtAudio::StreamOptions *options )

{
#if defined(__RTAUDIO_DEBUG__)
  struct SndOutputTdealloc {
    SndOutputTdealloc() : _out(NULL) { snd_output_stdio_attach(&_out, stderr, 0); }
    ~SndOutputTdealloc() { snd_output_close(_out); }
    operator snd_output_t*() { return _out; }
    snd_output_t *_out;
  } out;
#endif

  std::string name;
  for ( auto& id : deviceIdPairs_) {
    if ( id.second == deviceId ) {
      name = id.first;
      break;
    }
  }

  snd_pcm_stream_t stream;
  if ( mode == OUTPUT )
    stream = SND_PCM_STREAM_PLAYBACK;
  else
    stream = SND_PCM_STREAM_CAPTURE;

  snd_pcm_t *phandle;
  int openMode = SND_PCM_ASYNC;
  int result = snd_pcm_open( &phandle, name.c_str(), stream, openMode );
  if ( result < 0 ) {
    if ( mode == OUTPUT )
      errorStream_ << "RtApiAlsa::probeDeviceOpen: pcm device (" << name << ") won't open for output.";
    else
      errorStream_ << "RtApiAlsa::probeDeviceOpen: pcm device (" << name << ") won't open for input.";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Fill the parameter structure.
  snd_pcm_hw_params_t *hw_params;
  snd_pcm_hw_params_alloca( &hw_params );
  result = snd_pcm_hw_params_any( phandle, hw_params );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error getting pcm device (" << name << ") parameters, " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

#if defined(__RTAUDIO_DEBUG__)
  fprintf( stderr, "\nRtApiAlsa: dump hardware params just after device open:\n\n" );
  snd_pcm_hw_params_dump( hw_params, out );
#endif

  // Set access ... check user preference.
  if ( options && options->flags & RTAUDIO_NONINTERLEAVED ) {
    stream_.userInterleaved = false;
    result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_NONINTERLEAVED );
    if ( result < 0 ) {
      result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_INTERLEAVED );
      stream_.deviceInterleaved[mode] =  true;
    }
    else
      stream_.deviceInterleaved[mode] = false;
  }
  else {
    stream_.userInterleaved = true;
    result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_INTERLEAVED );
    if ( result < 0 ) {
      result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_NONINTERLEAVED );
      stream_.deviceInterleaved[mode] =  false;
    }
    else
      stream_.deviceInterleaved[mode] =  true;
  }

  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting pcm device (" << name << ") access, " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Determine how to set the device format.
  stream_.userFormat = format;
  snd_pcm_format_t deviceFormat = SND_PCM_FORMAT_UNKNOWN;

  if ( format == RTAUDIO_SINT8 )
    deviceFormat = SND_PCM_FORMAT_S8;
  else if ( format == RTAUDIO_SINT16 )
    deviceFormat = SND_PCM_FORMAT_S16;
  else if ( format == RTAUDIO_SINT24 )
    deviceFormat = SND_PCM_FORMAT_S24;
  else if ( format == RTAUDIO_SINT32 )
    deviceFormat = SND_PCM_FORMAT_S32;
  else if ( format == RTAUDIO_FLOAT32 )
    deviceFormat = SND_PCM_FORMAT_FLOAT;
  else if ( format == RTAUDIO_FLOAT64 )
    deviceFormat = SND_PCM_FORMAT_FLOAT64;

  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat) == 0) {
    stream_.deviceFormat[mode] = format;
    goto setFormat;
  }

  // The user requested format is not natively supported by the device.
  deviceFormat = SND_PCM_FORMAT_FLOAT64;
  if ( snd_pcm_hw_params_test_format( phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_FLOAT64;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_FLOAT;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_FLOAT32;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S32;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT32;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S24;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT24;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S16;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT16;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S8;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT8;
    goto setFormat;
  }

  // If we get here, no supported format was found.
  snd_pcm_close( phandle );
  errorStream_ << "RtApiAlsa::probeDeviceOpen: pcm device (" << name << ") data format not supported by RtAudio.";
  errorText_ = errorStream_.str();
  return FAILURE;

 setFormat:
  result = snd_pcm_hw_params_set_format( phandle, hw_params, deviceFormat );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting pcm device (" << name << ") data format, " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Determine whether byte-swaping is necessary.
  stream_.doByteSwap[mode] = false;
  if ( deviceFormat != SND_PCM_FORMAT_S8 ) {
    result = snd_pcm_format_cpu_endian( deviceFormat );
    if ( result == 0 )
      stream_.doByteSwap[mode] = true;
    else if (result < 0) {
      snd_pcm_close( phandle );
      errorStream_ << "RtApiAlsa::probeDeviceOpen: error getting pcm device (" << name << ") endian-ness, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      return FAILURE;
    }
  }

  // Set the sample rate.
  result = snd_pcm_hw_params_set_rate_near( phandle, hw_params, (unsigned int*) &sampleRate, 0 );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting sample rate on device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Determine the number of channels for this device.  We support a possible
  // minimum device channel number > than the value requested by the user.
  stream_.nUserChannels[mode] = channels;
  unsigned int value;
  result = snd_pcm_hw_params_get_channels_max( hw_params, &value );
  unsigned int deviceChannels = value;
  if ( result < 0 || deviceChannels < channels + firstChannel ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: requested channel parameters not supported by device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  result = snd_pcm_hw_params_get_channels_min( hw_params, &value );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error getting minimum channels for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }
  deviceChannels = value;
  if ( deviceChannels < channels + firstChannel ) deviceChannels = channels + firstChannel;
  stream_.nDeviceChannels[mode] = deviceChannels;

  // Set the device channels.
  result = snd_pcm_hw_params_set_channels( phandle, hw_params, deviceChannels );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting channels for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Set the buffer (or period) size.
  int dir = 0;
  snd_pcm_uframes_t periodSize = *bufferSize;
  result = snd_pcm_hw_params_set_period_size_near( phandle, hw_params, &periodSize, &dir );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting period size for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }
  *bufferSize = periodSize;

  // Set the buffer number, which in ALSA is referred to as the "period".
  unsigned int periods = 0;
  if ( options && options->flags & RTAUDIO_MINIMIZE_LATENCY ) periods = 2;
  if ( options && options->numberOfBuffers > 0 ) periods = options->numberOfBuffers;
  if ( periods < 2 ) periods = 4; // a fairly safe default value
  result = snd_pcm_hw_params_set_periods_near( phandle, hw_params, &periods, &dir );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting periods for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // If attempting to setup a duplex stream, the bufferSize parameter
  // MUST be the same in both directions!
  if ( stream_.mode == OUTPUT && mode == INPUT && *bufferSize != stream_.bufferSize ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: system error setting buffer size for duplex stream on device (" << name << ").";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  stream_.bufferSize = *bufferSize;

  // Install the hardware configuration
  result = snd_pcm_hw_params( phandle, hw_params );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error installing hardware configuration on device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

#if defined(__RTAUDIO_DEBUG__)
  fprintf(stderr, "\nRtApiAlsa: dump hardware params after installation:\n\n");
  snd_pcm_hw_params_dump( hw_params, out );
#endif

  // Set the software configuration to fill buffers with zeros and prevent device stopping on xruns.
  snd_pcm_sw_params_t *sw_params = NULL;
  snd_pcm_sw_params_alloca( &sw_params );
  snd_pcm_sw_params_current( phandle, sw_params );
  snd_pcm_sw_params_set_start_threshold( phandle, sw_params, *bufferSize );
  snd_pcm_sw_params_set_stop_threshold( phandle, sw_params, ULONG_MAX );
  snd_pcm_sw_params_set_silence_threshold( phandle, sw_params, 0 );

  // The following two settings were suggested by Theo Veenker
  //snd_pcm_sw_params_set_avail_min( phandle, sw_params, *bufferSize );
  //snd_pcm_sw_params_set_xfer_align( phandle, sw_params, 1 );

  // here are two options for a fix
  //snd_pcm_sw_params_set_silence_size( phandle, sw_params, ULONG_MAX );
  snd_pcm_uframes_t val;
  snd_pcm_sw_params_get_boundary( sw_params, &val );
  snd_pcm_sw_params_set_silence_size( phandle, sw_params, val );

  result = snd_pcm_sw_params( phandle, sw_params );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error installing software configuration on device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

#if defined(__RTAUDIO_DEBUG__)
  fprintf(stderr, "\nRtApiAlsa: dump software params after installation:\n\n");
  snd_pcm_sw_params_dump( sw_params, out );
#endif

  // Set flags for buffer conversion
  stream_.doConvertBuffer[mode] = false;
  if ( stream_.userFormat != stream_.deviceFormat[mode] )
    stream_.doConvertBuffer[mode] = true;
  if ( stream_.nUserChannels[mode] < stream_.nDeviceChannels[mode] )
    stream_.doConvertBuffer[mode] = true;
  if ( stream_.userInterleaved != stream_.deviceInterleaved[mode] &&
       stream_.nUserChannels[mode] > 1 )
    stream_.doConvertBuffer[mode] = true;

  // Allocate the ApiHandle if necessary and then save.
  AlsaHandle *apiInfo = 0;
  if ( stream_.apiHandle == 0 ) {
    try {
      apiInfo = (AlsaHandle *) new AlsaHandle;
    }
    catch ( std::bad_alloc& ) {
      errorText_ = "RtApiAlsa::probeDeviceOpen: error allocating AlsaHandle memory.";
      goto error;
    }

    if ( pthread_cond_init( &apiInfo->runnable_cv, NULL ) ) {
      errorText_ = "RtApiAlsa::probeDeviceOpen: error initializing pthread condition variable.";
      goto error;
    }

    stream_.apiHandle = (void *) apiInfo;
    apiInfo->handles[0] = 0;
    apiInfo->handles[1] = 0;
  }
  else {
    apiInfo = (AlsaHandle *) stream_.apiHandle;
  }
  apiInfo->handles[mode] = phandle;
  phandle = 0;

  // Allocate necessary internal buffers.
  unsigned long bufferBytes;
  bufferBytes = stream_.nUserChannels[mode] * *bufferSize * formatBytes( stream_.userFormat );
  stream_.userBuffer[mode] = (char *) calloc( bufferBytes, 1 );
  if ( stream_.userBuffer[mode] == NULL ) {
    errorText_ = "RtApiAlsa::probeDeviceOpen: error allocating user buffer memory.";
    goto error;
  }

  if ( stream_.doConvertBuffer[mode] ) {

    bool makeBuffer = true;
    bufferBytes = stream_.nDeviceChannels[mode] * formatBytes( stream_.deviceFormat[mode] );
    if ( mode == INPUT ) {
      if ( stream_.mode == OUTPUT && stream_.deviceBuffer ) {
        unsigned long bytesOut = stream_.nDeviceChannels[0] * formatBytes( stream_.deviceFormat[0] );
        if ( bufferBytes <= bytesOut ) makeBuffer = false;
      }
    }

    if ( makeBuffer ) {
      bufferBytes *= *bufferSize;
      if ( stream_.deviceBuffer ) free( stream_.deviceBuffer );
      stream_.deviceBuffer = (char *) calloc( bufferBytes, 1 );
      if ( stream_.deviceBuffer == NULL ) {
        errorText_ = "RtApiAlsa::probeDeviceOpen: error allocating device buffer memory.";
        goto error;
      }
    }
  }

  stream_.sampleRate = sampleRate;
  stream_.nBuffers = periods;
  stream_.deviceId[mode] = deviceId;
  stream_.state = STREAM_STOPPED;

  // Setup the buffer conversion information structure.
  if ( stream_.doConvertBuffer[mode] ) setConvertInfo( mode, firstChannel );

  // Setup thread if necessary.
  if ( stream_.mode == OUTPUT && mode == INPUT ) {
    // We had already set up an output stream.
    stream_.mode = DUPLEX;
    // Link the streams if possible.
    apiInfo->synchronized = false;
    if ( snd_pcm_link( apiInfo->handles[0], apiInfo->handles[1] ) == 0 )
      apiInfo->synchronized = true;
    else {
      errorText_ = "RtApiAlsa::probeDeviceOpen: unable to synchronize input and output devices.";
      error( RTAUDIO_WARNING );
    }
  }
  else {
    stream_.mode = mode;

    // Setup callback thread.
    stream_.callbackInfo.object = (void *) this;

    // Set the thread attributes for joinable and realtime scheduling
    // priority (optional).  The higher priority will only take affect
    // if the program is run as root or suid. Note, under Linux
    // processes with CAP_SYS_NICE privilege, a user can change
    // scheduling policy and priority (thus need not be root). See
    // POSIX "capabilities".
    pthread_attr_t attr;
    pthread_attr_init( &attr );
    pthread_attr_setdetachstate( &attr, PTHREAD_CREATE_JOINABLE );
#ifdef SCHED_RR // Undefined with some OSes (e.g. NetBSD 1.6.x with GNU Pthread)
    if ( options && options->flags & RTAUDIO_SCHEDULE_REALTIME ) {
      stream_.callbackInfo.doRealtime = true;
      struct sched_param param;
      int priority = options->priority;
      int min = sched_get_priority_min( SCHED_RR );
      int max = sched_get_priority_max( SCHED_RR );
      if ( priority < min ) priority = min;
      else if ( priority > max ) priority = max;
      param.sched_priority = priority;

      // Set the policy BEFORE the priority. Otherwise it fails.
      pthread_attr_setschedpolicy(&attr, SCHED_RR);
      pthread_attr_setscope (&attr, PTHREAD_SCOPE_SYSTEM);
      // This is definitely required. Otherwise it fails.
      pthread_attr_setinheritsched(&attr, PTHREAD_EXPLICIT_SCHED);
      pthread_attr_setschedparam(&attr, &param);
    }
    else
      pthread_attr_setschedpolicy( &attr, SCHED_OTHER );
#else
    pthread_attr_setschedpolicy( &attr, SCHED_OTHER );
#endif

    stream_.callbackInfo.isRunning = true;
    result = pthread_create( &stream_.callbackInfo.thread, &attr, alsaCallbackHandler, &stream_.callbackInfo );
    pthread_attr_destroy( &attr );
    if ( result ) {
      // Failed. Try instead with default attributes.
      result = pthread_create( &stream_.callbackInfo.thread, NULL, alsaCallbackHandler, &stream_.callbackInfo );
      if ( result ) {
        stream_.callbackInfo.isRunning = false;
        errorText_ = "RtApiAlsa::error creating callback thread!";
        goto error;
      }
    }
  }

  return SUCCESS;

 error:
  if ( apiInfo ) {
    pthread_cond_destroy( &apiInfo->runnable_cv );
    if ( apiInfo->handles[0] ) snd_pcm_close( apiInfo->handles[0] );
    if ( apiInfo->handles[1] ) snd_pcm_close( apiInfo->handles[1] );
    delete apiInfo;
    stream_.apiHandle = 0;
  }

  if ( phandle) snd_pcm_close( phandle );

  for ( int i=0; i<2; i++ ) {
    if ( stream_.userBuffer[i] ) {
      free( stream_.userBuffer[i] );
      stream_.userBuffer[i] = 0;
    }
  }

  if ( stream_.deviceBuffer ) {
    free( stream_.deviceBuffer );
    stream_.deviceBuffer = 0;
  }

  stream_.state = STREAM_CLOSED;
  return FAILURE;
}